

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O1

void asio::detail::thread_info_base::deallocate<asio::detail::thread_info_base::default_tag>
               (long *param_1,undefined1 *param_2,ulong param_3)

{
  bool bVar1;
  
  if (param_1 == (long *)0x0 || 0x3fc < param_3) {
LAB_00117eff:
    operator_delete(param_2);
    return;
  }
  if (*param_1 == 0) {
    *param_2 = param_2[param_3];
    *param_1 = (long)param_2;
  }
  else {
    bVar1 = false;
    do {
      if (bVar1) goto LAB_00117eff;
      bVar1 = true;
    } while (param_1[1] != 0);
    *param_2 = param_2[param_3];
    param_1[1] = (long)param_2;
  }
  return;
}

Assistant:

static void deallocate(Purpose, thread_info_base* this_thread,
      void* pointer, std::size_t size)
  {
    if (size <= chunk_size * UCHAR_MAX)
    {
      if (this_thread)
      {
        for (int mem_index = Purpose::begin_mem_index;
            mem_index < Purpose::end_mem_index; ++mem_index)
        {
          if (this_thread->reusable_memory_[mem_index] == 0)
          {
            unsigned char* const mem = static_cast<unsigned char*>(pointer);
            mem[0] = mem[size];
            this_thread->reusable_memory_[mem_index] = pointer;
            return;
          }
        }
      }
    }

    aligned_delete(pointer);
  }